

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

Float * __thiscall pbrt::RGB::operator[](RGB *this,int c)

{
  int c_local;
  RGB *this_local;
  RGB *local_8;
  
  local_8 = this;
  if (c != 0) {
    if (c == 1) {
      local_8 = (RGB *)&this->g;
    }
    else {
      local_8 = (RGB *)&this->b;
    }
  }
  return &local_8->r;
}

Assistant:

PBRT_CPU_GPU
    Float &operator[](int c) {
        DCHECK(c >= 0 && c < 3);
        if (c == 0)
            return r;
        else if (c == 1)
            return g;
        return b;
    }